

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalGenerator *this)

{
  if (this->ExtraGenerator == (cmExternalMakefileProjectGenerator *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&this->ExtraGenerator->Name);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::GetExtraGeneratorName() const
{
  return this->ExtraGenerator ? this->ExtraGenerator->GetName()
                              : std::string();
}